

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

int color(char type,CHAR_DATA *ch,char *string)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  char *in_RDX;
  long in_RSI;
  undefined1 in_DIL;
  __type_conflict2 _Var4;
  char *p;
  char code [20];
  CHAR_DATA *in_stack_ffffffffffffffa8;
  char *local_40;
  char local_38 [32];
  char *local_18;
  long local_10;
  undefined1 local_5;
  int local_4;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_5 = in_DIL;
  bVar2 = is_npc(in_stack_ffffffffffffffa8);
  if ((bVar2) &&
     (uVar1 = *(ulong *)(local_10 + 0x180), _Var4 = std::pow<int,int>(0,0x5b30ae),
     (uVar1 & (long)_Var4) == 0)) {
    local_4 = 0;
  }
  else {
    switch(local_5) {
    case 0x2a:
      sprintf(local_38,"%c",7);
      break;
    default:
      sprintf(local_38,"\x1b[0m");
      break;
    case 0x2f:
      sprintf(local_38,"%c",10);
      break;
    case 0x42:
      sprintf(local_38,"\x1b[1;34m");
      break;
    case 0x43:
      sprintf(local_38,"\x1b[1;36m");
      break;
    case 0x44:
      sprintf(local_38,"\x1b[1;30m");
      break;
    case 0x47:
      sprintf(local_38,"\x1b[1;32m");
      break;
    case 0x4d:
      sprintf(local_38,"\x1b[1;35m");
      break;
    case 0x52:
      sprintf(local_38,"\x1b[1;31m");
      break;
    case 0x57:
      sprintf(local_38,"\x1b[1;37m");
      break;
    case 0x59:
      sprintf(local_38,"\x1b[1;33m");
      break;
    case 0x62:
      sprintf(local_38,"\x1b[0;34m");
      break;
    case 99:
      sprintf(local_38,"\x1b[0;36m");
      break;
    case 0x67:
      sprintf(local_38,"\x1b[0;32m");
      break;
    case 0x6d:
      sprintf(local_38,"\x1b[0;35m");
      break;
    case 0x72:
      sprintf(local_38,"\x1b[0;31m");
      break;
    case 0x77:
      sprintf(local_38,"\x1b[0;37m");
      break;
    case 0x78:
      sprintf(local_38,"\x1b[0m");
      break;
    case 0x79:
      sprintf(local_38,"\x1b[0;33m");
      break;
    case 0x7b:
      sprintf(local_38,"%c",0x7b);
      break;
    case 0x7c:
      sprintf(local_38,"\n\r");
    }
    local_40 = local_38;
    while (*local_40 != '\0') {
      *local_18 = *local_40;
      local_18[1] = '\0';
      local_40 = local_40 + 1;
      local_18 = local_18 + 1;
    }
    sVar3 = strlen(local_38);
    local_4 = (int)sVar3;
  }
  return local_4;
}

Assistant:

int color(char type, CHAR_DATA *ch, char *string)
{
	char code[20];
	char *p = (char *)'\0';

	if (is_npc(ch) && !IS_SET(ch->act, ACT_WARD_MOB))
		return 0;

	switch (type)
	{
		case 'x':
			sprintf(code, CLEAR);
			break;
		case 'b':
			sprintf(code, C_BLUE);
			break;
		case 'c':
			sprintf(code, C_CYAN);
			break;
		case 'g':
			sprintf(code, C_GREEN);
			break;
		case 'm':
			sprintf(code, C_MAGENTA);
			break;
		case 'r':
			sprintf(code, C_RED);
			break;
		case 'w':
			sprintf(code, C_WHITE);
			break;
		case 'y':
			sprintf(code, C_YELLOW);
			break;
		case 'B':
			sprintf(code, C_B_BLUE);
			break;
		case 'C':
			sprintf(code, C_B_CYAN);
			break;
		case 'G':
			sprintf(code, C_B_GREEN);
			break;
		case 'M':
			sprintf(code, C_B_MAGENTA);
			break;
		case 'R':
			sprintf(code, C_B_RED);
			break;
		case 'W':
			sprintf(code, C_B_WHITE);
			break;
		case 'Y':
			sprintf(code, C_B_YELLOW);
			break;
		case 'D':
			sprintf(code, C_D_GREY);
			break;
		case '*':
			sprintf(code, "%c", 007);
			break;
		case '/':
			sprintf(code, "%c", 012);
			break;
		case '{':
			sprintf(code, "%c", '{');
			break;
		case '|':
			sprintf(code, "\n\r");
			break;
		default:
			sprintf(code, CLEAR);
			break;
	}

	p = code;

	while (*p != '\0')
	{
		*string = *p++;
		*++string = '\0';
	}

	return strlen(code);
}